

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

void JS_FreeCString(JSContext *ctx,char *ptr)

{
  JSValue v;
  
  if (ptr != (char *)0x0) {
    v.u.ptr = ptr + -0x10;
    v.tag = -7;
    JS_FreeValue(ctx,v);
    return;
  }
  return;
}

Assistant:

void JS_FreeCString(JSContext *ctx, const char *ptr)
{
    JSString *p;
    if (!ptr)
        return;
    /* purposely removing constness */
    p = (JSString *)(void *)(ptr - offsetof(JSString, u));
    JS_FreeValue(ctx, JS_MKPTR(JS_TAG_STRING, p));
}